

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHooks.cpp
# Opt level: O3

HRESULT OnChakraCoreLoaded(OnChakraCoreLoadedPtr pfChakraCoreLoaded)

{
  HRESULT HVar1;
  HMODULE hModule;
  undefined1 local_2a68 [8];
  TestHooks testHooks;
  
  if (pfChakraCoreLoaded == (OnChakraCoreLoadedPtr)0x0) {
    hModule = GetModuleHandleW((LPCWSTR)0x0);
    pfChakraCoreLoaded = (OnChakraCoreLoadedPtr)GetProcAddress(hModule,"OnChakraCoreLoadedEntry");
    if (pfChakraCoreLoaded == (OnChakraCoreLoadedPtr)0x0) {
      return 0;
    }
  }
  memcpy((TestHooks *)local_2a68,&PTR_SetConfigFlags_014bfe98,0x2a50);
  HVar1 = (*pfChakraCoreLoaded)((TestHooks *)local_2a68);
  return HVar1;
}

Assistant:

HRESULT OnChakraCoreLoaded(OnChakraCoreLoadedPtr pfChakraCoreLoaded)
{
    if (pfChakraCoreLoaded == nullptr)
    {
        pfChakraCoreLoaded = (OnChakraCoreLoadedPtr)GetProcAddress(GetModuleHandle(NULL), "OnChakraCoreLoadedEntry");
        if (pfChakraCoreLoaded == nullptr)
        {
            return S_OK;
        }
    }

    TestHooks testHooks =
    {
        SetConfigFlags,
        SetConfigFile,
        PrintConfigFlagsUsageString,
        SetAssertToConsoleFlag,
        SetEnableCheckMemoryLeakOutput,
        PlatformAgnostic::UnicodeText::Internal::LogicalStringCompareImpl,

        //BigInt hooks
        Js::JavascriptBigInt::AddDigit,
        Js::JavascriptBigInt::SubDigit,
        Js::JavascriptBigInt::MulDigit,

#define FLAG(type, name, description, defaultValue, ...) FLAG_##type##(name)
#define FLAGINCLUDE(name) \
    IsEnabled##name##Flag, \
    Get##name##Flag, \
    Set##name##Flag,
#define FLAG_String(name) FLAGINCLUDE(name)
#define FLAG_Boolean(name) FLAGINCLUDE(name)
#define FLAG_Number(name) FLAGINCLUDE(name)
#define FLAG_Phases(name)
#define FLAG_NumberSet(name)
#define FLAG_NumberPairSet(name)
#define FLAG_NumberTrioSet(name)
#define FLAG_NumberRange(name)
#include "ConfigFlagsList.h"
#undef FLAG
#undef FLAG_String
#undef FLAG_Boolean
#undef FLAG_Number
#undef FLAG_Phases
#undef FLAG_NumberSet
#undef FLAG_NumberPairSet
#undef FLAG_NumberTrioSet
#undef FLAG_NumberRange
        NotifyUnhandledException
    };
    return pfChakraCoreLoaded(testHooks);
}